

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

bool Am_Value_List::List_Or_Value_Equal(Am_Value *v1,Am_Value *v2)

{
  bool bVar1;
  undefined1 local_30 [8];
  Am_Value_List l;
  Am_Value *v2_local;
  Am_Value *v1_local;
  
  l.item = (Am_List_Item *)v2;
  bVar1 = Am_Value::operator==(v1,v2);
  if (bVar1) {
    v1_local._7_1_ = true;
  }
  else {
    Am_Value_List((Am_Value_List *)local_30);
    bVar1 = Test(v1);
    if ((((bVar1) && (operator=((Am_Value_List *)local_30,v1), local_30 != (undefined1  [8])0x0)) &&
        (*(short *)&((Am_Wrapper *)local_30)->field_0xc == 1)) &&
       (bVar1 = Am_Value::operator==
                          (&(*(Am_List_Item **)((long)local_30 + 0x10))->super_Am_Value,
                           &(l.item)->super_Am_Value), bVar1)) {
      v1_local._7_1_ = true;
    }
    else {
      bVar1 = Test(&(l.item)->super_Am_Value);
      if (((bVar1) &&
          (operator=((Am_Value_List *)local_30,&(l.item)->super_Am_Value),
          local_30 != (undefined1  [8])0x0)) &&
         ((*(short *)&((Am_Wrapper *)local_30)->field_0xc == 1 &&
          (bVar1 = Am_Value::operator==
                             (&(*(Am_List_Item **)((long)local_30 + 0x10))->super_Am_Value,v1),
          bVar1)))) {
        v1_local._7_1_ = true;
      }
      else {
        v1_local._7_1_ = false;
      }
    }
    ~Am_Value_List((Am_Value_List *)local_30);
  }
  return v1_local._7_1_;
}

Assistant:

bool
Am_Value_List::List_Or_Value_Equal(const Am_Value &v1, const Am_Value &v2)
{
  if (v1 == v2)
    return true;
  Am_Value_List l;
  if (Am_Value_List::Test(v1)) {
    l = v1;
    if (l.data && l.data->number == 1 && *(l.data->head) == v2)
      return true;
  }
  if (Am_Value_List::Test(v2)) {
    l = v2;
    if (l.data && l.data->number == 1 && *(l.data->head) == v1)
      return true;
  }
  return false;
}